

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bind_create.cpp
# Opt level: O3

SchemaCatalogEntry * __thiscall
duckdb::Binder::BindCreateFunctionInfo(Binder *this,CreateInfo *info)

{
  _Hash_node_base *p_Var1;
  _Hash_node_base *p_Var2;
  pointer puVar3;
  pointer pcVar4;
  _func_int **pp_Var5;
  bool bVar6;
  RETURN_TYPE RVar7;
  int iVar8;
  pointer pMVar9;
  ScalarMacroFunction *pSVar10;
  pointer pPVar11;
  BaseExpression *pBVar12;
  ColumnRefExpression *pCVar13;
  string *__x;
  ConstantExpression *pCVar14;
  ExceptionType *pEVar15;
  SchemaCatalogEntry *pSVar16;
  BinderException *pBVar17;
  pointer this_00;
  __node_base *p_Var18;
  unique_ptr<duckdb::MacroFunction,_std::default_delete<duckdb::MacroFunction>,_true> *this_01;
  size_type parameter_count;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  dummy_names;
  vector<duckdb::LogicalType,_true> dummy_types;
  BoundGroupInformation group_info;
  ErrorData error;
  unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
  positional_parameters;
  BoundSelectNode sel_node;
  SelectBinder binder;
  _Head_base<0UL,_duckdb::ParsedExpression_*,_false> local_6c0;
  DummyBinding *local_6b8;
  _Hash_node_base *local_6b0;
  undefined8 local_6a8;
  undefined8 uStack_6a0;
  undefined8 local_698;
  undefined8 local_688;
  undefined8 uStack_680;
  undefined8 local_678;
  _Any_data local_670;
  code *local_660;
  code *local_658;
  LogicalDependencyList *local_650;
  Catalog *local_648;
  _func_int **local_640;
  undefined8 *local_638;
  __node_base_ptr *local_630;
  undefined8 *local_628;
  __node_base *local_620;
  undefined8 *local_618;
  CreateInfo *local_610;
  unique_ptr<duckdb::MacroFunction,_std::default_delete<duckdb::MacroFunction>,_true> *local_608;
  DBConfig *local_600;
  unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
  *local_5f8;
  undefined1 local_5f0 [8];
  _Alloc_hider local_5e8;
  char local_5e0 [8];
  char local_5d8 [16];
  _Alloc_hider local_5c8;
  char local_5b8 [16];
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_5a8 [56];
  undefined1 local_570 [32];
  float local_550;
  size_t local_548;
  __node_base_ptr p_Stack_540;
  __node_base_ptr *local_538;
  size_type local_530;
  __node_base local_528;
  size_type sStack_520;
  float local_518;
  size_t local_510;
  __node_base_ptr p_Stack_508;
  _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_500;
  undefined1 local_4c8 [8];
  _Alloc_hider local_4c0;
  char local_4b0 [16];
  _Alloc_hider local_4a0;
  char local_490 [16];
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_480 [56];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_448;
  _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  local_428;
  string local_3f0;
  undefined1 local_3d0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3b0;
  optional_idx local_3a0;
  pointer pbStack_398;
  pointer local_390;
  pointer pbStack_388;
  pointer local_380;
  __node_base_ptr *local_378;
  size_type local_370;
  __node_base local_368;
  size_type sStack_360;
  float local_358;
  undefined8 local_350;
  __node_base_ptr p_Stack_348;
  __node_base_ptr *local_340;
  size_type local_338;
  undefined8 local_330 [2];
  float local_320;
  size_t local_318;
  __node_base_ptr p_Stack_310;
  pointer local_308;
  pointer puStack_300;
  pointer local_2f8;
  __node_base_ptr *local_2f0;
  size_type local_2e8;
  __node_base local_2e0;
  size_type sStack_2d8;
  float local_2d0;
  size_t local_2c8;
  __node_base_ptr p_Stack_2c0;
  __node_base_ptr *local_2b8;
  size_type local_2b0;
  undefined8 local_2a8 [2];
  float local_298;
  size_t local_290;
  __node_base_ptr p_Stack_288;
  __node_base_ptr *local_280;
  size_type local_278;
  __node_base local_270;
  size_type sStack_268;
  float local_260;
  undefined1 local_258 [8];
  __node_base_ptr local_250 [19];
  idx_t local_1b8;
  pointer local_188;
  pointer puStack_180;
  pointer local_178;
  pointer pvStack_170;
  pointer local_168;
  pointer pvStack_160;
  __node_base_ptr *local_158;
  size_type local_150;
  __node_base local_148;
  size_type sStack_140;
  float local_138;
  size_t local_130;
  __node_base_ptr ap_Stack_128 [2];
  pointer local_118;
  pointer puStack_110;
  pointer local_108;
  __node_base_ptr *local_100;
  size_type local_f8;
  __node_base local_f0;
  size_type sStack_e8;
  float local_e0;
  size_t local_d8;
  __node_base_ptr ap_Stack_d0 [2];
  bool local_c0;
  SelectBinder local_b8;
  
  local_648 = Catalog::GetCatalog(this->context,&info->catalog);
  local_600 = DBConfig::GetConfig(this->context);
  local_428._M_buckets = &local_428._M_single_bucket;
  local_428._M_bucket_count = 1;
  local_428._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_428._M_element_count = 0;
  local_428._M_rehash_policy._M_max_load_factor = 1.0;
  local_428._M_rehash_policy._M_next_resize = 0;
  local_428._M_single_bucket = (__node_base_ptr)0x0;
  this_01 = (unique_ptr<duckdb::MacroFunction,_std::default_delete<duckdb::MacroFunction>,_true> *)
            info[1].sql._M_dataplus._M_p;
  local_608 = (unique_ptr<duckdb::MacroFunction,_std::default_delete<duckdb::MacroFunction>,_true> *
              )info[1].sql._M_string_length;
  if (this_01 != local_608) {
    local_650 = &info->dependencies;
    local_610 = info + 1;
    local_628 = &local_350;
    local_638 = local_330;
    local_618 = local_2a8;
    local_630 = &local_500._M_single_bucket;
    local_620 = &local_500._M_before_begin;
    local_640 = (_func_int **)&PTR__BoundSelectNode_01981da8;
    do {
      pMVar9 = unique_ptr<duckdb::MacroFunction,_std::default_delete<duckdb::MacroFunction>,_true>::
               operator->(this_01);
      pSVar10 = MacroFunction::Cast<duckdb::ScalarMacroFunction>(pMVar9);
      pPVar11 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                ::operator->(&pSVar10->expression);
      iVar8 = (*(pPVar11->super_BaseExpression)._vptr_BaseExpression[6])(pPVar11);
      if ((char)iVar8 != '\0') {
        pBVar17 = (BinderException *)__cxa_allocate_exception(0x10);
        local_3d0._0_8_ = local_3d0 + 0x10;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_3d0,"Parameter expressions within macro\'s are not supported!",""
                  );
        BinderException::BinderException(pBVar17,(string *)local_3d0);
        __cxa_throw(pBVar17,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
      }
      local_688 = 0;
      uStack_680 = 0;
      local_678 = 0;
      local_698 = 0;
      local_6a8 = 0;
      uStack_6a0 = 0;
      pMVar9 = unique_ptr<duckdb::MacroFunction,_std::default_delete<duckdb::MacroFunction>,_true>::
               operator->(this_01);
      local_6b0 = (_Hash_node_base *)
                  ((long)(pMVar9->parameters).
                         super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                         .
                         super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)(pMVar9->parameters).
                         super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                         .
                         super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                         ._M_impl.super__Vector_impl_data._M_start >> 3);
      if (local_428._M_buckets[(ulong)local_6b0 % local_428._M_bucket_count] != (__node_base_ptr)0x0
         ) {
        p_Var1 = local_428._M_buckets[(ulong)local_6b0 % local_428._M_bucket_count]->_M_nxt;
        p_Var2 = p_Var1[1]._M_nxt;
        do {
          if (local_6b0 == p_Var2) {
            pBVar17 = (BinderException *)__cxa_allocate_exception(0x10);
            local_3d0._0_8_ = local_3d0 + 0x10;
            ::std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_3d0,
                       "Ambiguity in macro overloads - macro \"%s\" has multiple definitions with %llu parameters"
                       ,"");
            local_448._M_dataplus._M_p = (pointer)&local_448.field_2;
            pp_Var5 = info[1].super_ParseInfo._vptr_ParseInfo;
            ::std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_448,pp_Var5,
                       *(long *)&info[1].super_ParseInfo.info_type + (long)pp_Var5);
            BinderException::BinderException<std::__cxx11::string,unsigned_long>
                      (pBVar17,(string *)local_3d0,&local_448,(unsigned_long)local_6b0);
            __cxa_throw(pBVar17,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
          }
          p_Var1 = p_Var1->_M_nxt;
        } while ((p_Var1 != (_Hash_node_base *)0x0) &&
                (p_Var2 = p_Var1[1]._M_nxt,
                (ulong)p_Var2 % local_428._M_bucket_count ==
                (ulong)local_6b0 % local_428._M_bucket_count));
      }
      local_3d0._0_8_ = &local_428;
      ::std::
      _Hashtable<unsigned_long,unsigned_long,std::allocator<unsigned_long>,std::__detail::_Identity,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
      ::
      _M_insert<unsigned_long_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_long,false>>>>
                ((_Hashtable<unsigned_long,unsigned_long,std::allocator<unsigned_long>,std::__detail::_Identity,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                  *)local_3d0._0_8_,&local_6b0,local_3d0);
      local_5f8 = &pSVar10->expression;
      pMVar9 = unique_ptr<duckdb::MacroFunction,_std::default_delete<duckdb::MacroFunction>,_true>::
               operator->(this_01);
      puVar3 = (pMVar9->parameters).
               super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
               .
               super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (this_00 = (pMVar9->parameters).
                     super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                     .
                     super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                     ._M_impl.super__Vector_impl_data._M_start; this_00 != puVar3;
          this_00 = this_00 + 1) {
        pBVar12 = &unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                   ::operator->(this_00)->super_BaseExpression;
        pCVar13 = BaseExpression::Cast<duckdb::ColumnRefExpression>(pBVar12);
        local_3d0._0_8_ = &PTR__BaseExpression_01968618;
        local_3d0[8] = (pCVar13->super_ParsedExpression).super_BaseExpression.type;
        local_3d0[9] = (pCVar13->super_ParsedExpression).super_BaseExpression.expression_class;
        local_3c0._M_allocated_capacity = (size_type)&local_3b0;
        pcVar4 = (pCVar13->super_ParsedExpression).super_BaseExpression.alias._M_dataplus._M_p;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)(local_3d0 + 0x10),pcVar4,
                   pcVar4 + (pCVar13->super_ParsedExpression).super_BaseExpression.alias.
                            _M_string_length);
        local_3a0.index =
             (pCVar13->super_ParsedExpression).super_BaseExpression.query_location.index;
        local_3d0._0_8_ = &PTR__ColumnRefExpression_01985170;
        ::std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&pbStack_398,
                 &(pCVar13->column_names).
                  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                );
        bVar6 = ColumnRefExpression::IsQualified((ColumnRefExpression *)local_3d0);
        if (bVar6) {
          pBVar17 = (BinderException *)__cxa_allocate_exception(0x10);
          local_570._0_8_ = local_570 + 0x10;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_570,"Invalid parameter name \'%s\': must be unqualified","");
          ColumnRefExpression::ToString_abi_cxx11_(&local_3f0,(ColumnRefExpression *)local_3d0);
          BinderException::BinderException<std::__cxx11::string>
                    (pBVar17,(string *)local_570,&local_3f0);
          __cxa_throw(pBVar17,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
        }
        ::std::vector<duckdb::LogicalType,std::allocator<duckdb::LogicalType>>::
        emplace_back<duckdb::LogicalTypeId_const&>
                  ((vector<duckdb::LogicalType,std::allocator<duckdb::LogicalType>> *)&local_688,
                   &LogicalType::UNKNOWN);
        __x = ColumnRefExpression::GetColumnName_abi_cxx11_((ColumnRefExpression *)local_3d0);
        ::std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&local_6a8,__x);
        local_3d0._0_8_ = &PTR__ColumnRefExpression_01985170;
        ::std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&pbStack_398);
        local_3d0._0_8_ = &PTR__BaseExpression_01968618;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3c0._M_allocated_capacity != &local_3b0) {
          operator_delete((void *)local_3c0._M_allocated_capacity);
        }
      }
      pMVar9 = unique_ptr<duckdb::MacroFunction,_std::default_delete<duckdb::MacroFunction>,_true>::
               operator->(this_01);
      p_Var18 = &(pMVar9->default_parameters)._M_h._M_before_begin;
      while (p_Var18 = p_Var18->_M_nxt, p_Var18 != (__node_base *)0x0) {
        pBVar12 = &unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                   ::operator->((unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                                 *)(p_Var18 + 5))->super_BaseExpression;
        pCVar14 = BaseExpression::Cast<duckdb::ConstantExpression>(pBVar12);
        ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::push_back
                  ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_688,
                   &(pCVar14->value).type_);
        ::std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&local_6a8,(value_type *)(p_Var18 + 1));
      }
      make_uniq<duckdb::DummyBinding,duckdb::vector<duckdb::LogicalType,true>&,duckdb::vector<std::__cxx11::string,true>&,std::__cxx11::string&>
                ((duckdb *)&local_6b8,(vector<duckdb::LogicalType,_true> *)&local_688,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                  *)&local_6a8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_610);
      (this->macro_binding).ptr = local_6b8;
      pPVar11 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                ::operator->(local_5f8);
      (*(pPVar11->super_BaseExpression)._vptr_BaseExpression[0xc])(&local_6c0,pPVar11);
      ExpressionBinder::QualifyColumnNames
                (this,(unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                       *)&local_6c0);
      local_3d0[8] = SELECT_NODE;
      local_380 = (pointer)0x0;
      local_390 = (pointer)0x0;
      pbStack_388 = (pointer)0x0;
      local_3a0.index = 0;
      pbStack_398 = (pointer)0x0;
      local_3b0._M_allocated_capacity = 0;
      local_3b0._8_8_ = 0;
      local_3c0._M_allocated_capacity = 0;
      local_3c0._8_8_ = (pointer)0x0;
      local_3d0._0_8_ = local_640;
      local_378 = &p_Stack_348;
      local_370 = 1;
      local_368._M_nxt = (_Hash_node_base *)0x0;
      sStack_360 = 0;
      local_358 = 1.0;
      *local_628 = 0;
      local_628[1] = 0;
      local_340 = &p_Stack_310;
      local_338 = 1;
      *local_638 = 0;
      local_638[1] = 0;
      local_320 = 1.0;
      local_2f8 = (pointer)0x0;
      local_308 = (pointer)0x0;
      puStack_300 = (pointer)0x0;
      local_318 = 0;
      p_Stack_310 = (__node_base_ptr)0x0;
      local_2f0 = &p_Stack_2c0;
      local_2e8 = 1;
      local_2e0._M_nxt = (_Hash_node_base *)0x0;
      sStack_2d8 = 0;
      local_2d0 = 1.0;
      local_2c8 = 0;
      p_Stack_2c0 = (__node_base_ptr)0x0;
      local_2b8 = &p_Stack_288;
      local_2b0 = 1;
      *local_618 = 0;
      local_618[1] = 0;
      local_298 = 1.0;
      local_290 = 0;
      p_Stack_288 = (__node_base_ptr)0x0;
      local_280 = local_250;
      local_278 = 1;
      local_270._M_nxt = (_Hash_node_base *)0x0;
      sStack_268 = 0;
      local_260 = 1.0;
      local_1b8 = 0;
      switchD_005681f0::default(local_258,0,0x98);
      local_188 = (pointer)0x0;
      puStack_180 = (pointer)0x0;
      local_178 = (pointer)0x0;
      pvStack_170 = (pointer)0x0;
      local_168 = (pointer)0x0;
      pvStack_160 = (pointer)0x0;
      local_158 = ap_Stack_128;
      local_150 = 1;
      local_148._M_nxt = (_Hash_node_base *)0x0;
      sStack_140 = 0;
      local_138 = 1.0;
      local_130 = 0;
      ap_Stack_128[0] = (__node_base_ptr)0x0;
      local_108 = (pointer)0x0;
      local_118 = (pointer)0x0;
      puStack_110 = (pointer)0x0;
      local_100 = ap_Stack_d0;
      local_f8 = 1;
      local_f0._M_nxt = (_Hash_node_base *)0x0;
      sStack_e8 = 0;
      local_e0 = 1.0;
      local_d8 = 0;
      ap_Stack_d0[0] = (__node_base_ptr)0x0;
      local_c0 = false;
      local_570._0_8_ = &p_Stack_540;
      local_570._8_8_ = 1;
      local_570._16_8_ = (_Hash_node_base *)0x0;
      local_570._24_8_ = 0;
      local_550 = 1.0;
      local_548 = 0;
      p_Stack_540 = (__node_base_ptr)0x0;
      local_538 = &p_Stack_508;
      local_530 = 1;
      local_528._M_nxt = (_Hash_node_base *)0x0;
      sStack_520 = 0;
      local_518 = 1.0;
      local_510 = 0;
      p_Stack_508 = (__node_base_ptr)0x0;
      local_500._M_buckets = local_630;
      local_500._M_bucket_count = 1;
      local_620->_M_nxt = (_Hash_node_base *)0x0;
      local_620[1] = (_Hash_node_base *)0x0;
      local_500._M_rehash_policy._M_max_load_factor = 1.0;
      local_500._M_rehash_policy._M_next_resize = 0;
      local_500._M_single_bucket = (__node_base_ptr)0x0;
      SelectBinder::SelectBinder
                (&local_b8,this,this->context,(BoundSelectNode *)local_3d0,
                 (BoundGroupInformation *)local_570);
      RVar7 = DBConfig::GetSetting<duckdb::EnableMacroDependenciesSetting>(local_600,this->context);
      if (RVar7) {
        local_670._M_unused._M_object = local_650;
        local_670._8_8_ = local_648;
        local_658 = ::std::
                    _Function_handler<void_(duckdb::CatalogEntry_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/lnkuiper[P]duckdb/src/planner/binder/statement/bind_create.cpp:236:36)>
                    ::_M_invoke;
        local_660 = ::std::
                    _Function_handler<void_(duckdb::CatalogEntry_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/lnkuiper[P]duckdb/src/planner/binder/statement/bind_create.cpp:236:36)>
                    ::_M_manager;
        ExpressionBinder::SetCatalogLookupCallback
                  ((ExpressionBinder *)&local_b8,(catalog_entry_callback_t *)&local_670);
        if (local_660 != (code *)0x0) {
          (*local_660)(&local_670,&local_670,__destroy_functor);
        }
      }
      ErrorData::ErrorData((ErrorData *)local_4c8);
      ExpressionBinder::Bind
                ((ErrorData *)local_5f0,(ExpressionBinder *)&local_b8,
                 (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                  *)&local_6c0,0,false);
      local_4c8._0_2_ = local_5f0._0_2_;
      ::std::__cxx11::string::operator=((string *)&local_4c0,(string *)&local_5e8);
      ::std::__cxx11::string::operator=((string *)&local_4a0,(string *)&local_5c8);
      ::std::
      _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
      ::_M_move_assign(local_480,local_5a8);
      ::std::
      _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
      ::~_Hashtable(local_5a8);
      if (local_5c8._M_p != local_5b8) {
        operator_delete(local_5c8._M_p);
      }
      if (local_5e8._M_p != local_5d8) {
        operator_delete(local_5e8._M_p);
      }
      if (local_4c8[0] == true) {
        local_5f0 = (undefined1  [8])local_5e0;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_5f0,anon_var_dwarf_643837b + 9);
        ErrorData::Throw((ErrorData *)local_4c8,(string *)local_5f0);
      }
      if (((local_4c8._0_2_ & 1) != 0) &&
         (pEVar15 = ErrorData::Type((ErrorData *)local_4c8), *pEVar15 != PARAMETER_NOT_RESOLVED)) {
        local_5f0 = (undefined1  [8])local_5e0;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_5f0,anon_var_dwarf_643837b + 9);
        ErrorData::Throw((ErrorData *)local_4c8,(string *)local_5f0);
      }
      ::std::
      _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
      ::~_Hashtable(local_480);
      if (local_4a0._M_p != local_490) {
        operator_delete(local_4a0._M_p);
      }
      if (local_4c0._M_p != local_4b0) {
        operator_delete(local_4c0._M_p);
      }
      ExpressionBinder::~ExpressionBinder((ExpressionBinder *)&local_b8);
      ::std::
      _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
      ::~_Hashtable(&local_500);
      ::std::
      _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
      ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                     *)&local_538);
      ::std::
      _Hashtable<std::reference_wrapper<duckdb::ParsedExpression>,_std::pair<const_std::reference_wrapper<duckdb::ParsedExpression>,_unsigned_long>,_std::allocator<std::pair<const_std::reference_wrapper<duckdb::ParsedExpression>,_unsigned_long>_>,_std::__detail::_Select1st,_duckdb::ExpressionEquality<duckdb::ParsedExpression>,_duckdb::ExpressionHashFunction<duckdb::ParsedExpression>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
      ::~_Hashtable((_Hashtable<std::reference_wrapper<duckdb::ParsedExpression>,_std::pair<const_std::reference_wrapper<duckdb::ParsedExpression>,_unsigned_long>,_std::allocator<std::pair<const_std::reference_wrapper<duckdb::ParsedExpression>,_unsigned_long>_>,_std::__detail::_Select1st,_duckdb::ExpressionEquality<duckdb::ParsedExpression>,_duckdb::ExpressionHashFunction<duckdb::ParsedExpression>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                     *)local_570);
      BoundSelectNode::~BoundSelectNode((BoundSelectNode *)local_3d0);
      if (local_6c0._M_head_impl != (ParsedExpression *)0x0) {
        (*((local_6c0._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
      }
      if (local_6b8 != (DummyBinding *)0x0) {
        (*(local_6b8->super_Binding)._vptr_Binding[1])();
      }
      ::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_6a8);
      ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
                ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_688);
      this_01 = this_01 + 1;
    } while (this_01 != local_608);
  }
  pSVar16 = BindCreateSchema(this,info);
  ::std::
  _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable(&local_428);
  return pSVar16;
}

Assistant:

SchemaCatalogEntry &Binder::BindCreateFunctionInfo(CreateInfo &info) {
	auto &base = info.Cast<CreateMacroInfo>();

	auto &dependencies = base.dependencies;
	auto &catalog = Catalog::GetCatalog(context, info.catalog);
	auto &db_config = DBConfig::GetConfig(context);
	// try to bind each of the included functions
	unordered_set<idx_t> positional_parameters;
	for (auto &function : base.macros) {
		auto &scalar_function = function->Cast<ScalarMacroFunction>();
		if (scalar_function.expression->HasParameter()) {
			throw BinderException("Parameter expressions within macro's are not supported!");
		}
		vector<LogicalType> dummy_types;
		vector<string> dummy_names;
		auto parameter_count = function->parameters.size();
		if (positional_parameters.find(parameter_count) != positional_parameters.end()) {
			throw BinderException(
			    "Ambiguity in macro overloads - macro \"%s\" has multiple definitions with %llu parameters", base.name,
			    parameter_count);
		}
		positional_parameters.insert(parameter_count);

		// positional parameters
		for (auto &param_expr : function->parameters) {
			auto param = param_expr->Cast<ColumnRefExpression>();
			if (param.IsQualified()) {
				throw BinderException("Invalid parameter name '%s': must be unqualified", param.ToString());
			}
			dummy_types.emplace_back(LogicalType::UNKNOWN);
			dummy_names.push_back(param.GetColumnName());
		}
		// default parameters
		for (auto &entry : function->default_parameters) {
			auto &val = entry.second->Cast<ConstantExpression>();
			dummy_types.push_back(val.value.type());
			dummy_names.push_back(entry.first);
		}
		auto this_macro_binding = make_uniq<DummyBinding>(dummy_types, dummy_names, base.name);
		macro_binding = this_macro_binding.get();

		// create a copy of the expression because we do not want to alter the original
		auto expression = scalar_function.expression->Copy();
		ExpressionBinder::QualifyColumnNames(*this, expression);

		// bind it to verify the function was defined correctly
		BoundSelectNode sel_node;
		BoundGroupInformation group_info;
		SelectBinder binder(*this, context, sel_node, group_info);
		bool should_create_dependencies = db_config.GetSetting<EnableMacroDependenciesSetting>(context);

		if (should_create_dependencies) {
			binder.SetCatalogLookupCallback([&dependencies, &catalog](CatalogEntry &entry) {
				if (&catalog != &entry.ParentCatalog()) {
					// Don't register any cross-catalog dependencies
					return;
				}
				// Register any catalog entry required to bind the macro function
				dependencies.AddDependency(entry);
			});
		}
		ErrorData error;
		try {
			error = binder.Bind(expression, 0, false);
			if (error.HasError()) {
				error.Throw();
			}
		} catch (const std::exception &ex) {
			error = ErrorData(ex);
		}
		// if we cannot resolve parameters we postpone binding until the macro function is used
		if (error.HasError() && error.Type() != ExceptionType::PARAMETER_NOT_RESOLVED) {
			error.Throw();
		}
	}

	return BindCreateSchema(info);
}